

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t * Acb_ObjCollectTfoVec(Acb_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  size_t __size;
  long lVar5;
  
  if ((p->vFanouts).nSize < 1) {
    iVar1 = (p->vObjType).nCap;
    if ((p->vFanouts).nCap < iVar1) {
      pVVar3 = (p->vFanouts).pArray;
      __size = (long)iVar1 << 4;
      if (pVVar3 == (Vec_Int_t *)0x0) {
        pVVar3 = (Vec_Int_t *)malloc(__size);
      }
      else {
        pVVar3 = (Vec_Int_t *)realloc(pVVar3,__size);
      }
      (p->vFanouts).pArray = pVVar3;
      lVar5 = (long)(p->vFanouts).nCap;
      memset(pVVar3 + lVar5,0,(iVar1 - lVar5) * 0x10);
      (p->vFanouts).nCap = iVar1;
    }
    (p->vFanouts).nSize = iVar1;
    if (1 < (p->vObjType).nSize) {
      lVar5 = 1;
      do {
        if ((p->vObjType).nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if ((p->vObjType).pArray[lVar5] != '\0') {
          Acb_ObjAddFaninFanout(p,(int)lVar5);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (p->vObjType).nSize);
    }
  }
  (p->vArray1).nSize = 0;
  if ((p->vObjTrav).nSize < 1) {
    uVar2 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar2) {
      piVar4 = (p->vObjTrav).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar2 << 2);
      }
      (p->vObjTrav).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar2 * 4);
    }
    (p->vObjTrav).nSize = uVar2;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (0 < vObjs->nSize) {
    lVar5 = 0;
    do {
      Acb_ObjCollectTfo_rec(p,vObjs->pArray[lVar5],0);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vObjs->nSize);
  }
  return &p->vArray1;
}

Assistant:

Vec_Int_t * Acb_ObjCollectTfoVec( Acb_Ntk_t * p, Vec_Int_t * vObjs )
{
    int i, iObj;
    if ( !Acb_NtkHasObjFanout(p) )
        Acb_NtkCreateFanout( p );
    Vec_IntClear( &p->vArray1 );
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Acb_ObjCollectTfo_rec( p, iObj, 0 );
    return &p->vArray1;
}